

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

void __thiscall wallet::SQLiteBatch::Close(SQLiteBatch *this)

{
  long lVar1;
  initializer_list<std::pair<sqlite3_stmt_**,_const_char_*>_> __l;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  bool bVar2;
  int source_line;
  ulong uVar3;
  type *pppsVar4;
  pair<sqlite3_stmt_**,_const_char_*> *ppVar5;
  long *in_RDI;
  long in_FS_OFFSET;
  runtime_error *anon_var_0;
  int res;
  type *stmt_description;
  type *stmt_prepared;
  vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
  *__range1;
  bool force_conn_refresh;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
  statements;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  char *in_stack_fffffffffffffdf0;
  pair<sqlite3_stmt_**,_const_char_*> *in_stack_fffffffffffffdf8;
  char *in_stack_fffffffffffffe00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe08;
  allocator_type *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  iterator ppVar6;
  undefined1 *puVar7;
  LogFlags in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe5c;
  ConstevalFormatString<0U> in_stack_fffffffffffffe98;
  ConstevalFormatString<2U> fmt;
  char *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  byte bVar8;
  long *plVar9;
  undefined8 local_140 [5];
  pair<sqlite3_stmt_**,_const_char_*> *local_118;
  pair<sqlite3_stmt_**,_const_char_*> *local_110;
  undefined1 local_101;
  char *local_100;
  long *local_f8;
  char *local_f0;
  long *local_e8;
  char *local_e0;
  long *local_d8;
  char *local_d0;
  long *local_c8;
  char *local_c0;
  long *local_b8;
  Level in_stack_ffffffffffffff90;
  char **in_stack_ffffffffffffffa0;
  sqlite3_stmt **in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar8 = 0;
  plVar9 = in_RDI;
  if ((*(byte *)(in_RDI + 8) & 1) != 0) {
    uVar3 = (**(code **)(*in_RDI + 0x68))();
    if ((uVar3 & 1) == 0) {
      bVar8 = 1;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      in_stack_fffffffffffffea0 =
           "SQLiteBatch: Batch closed and failed to abort transaction, resetting db connection..\n";
      in_stack_fffffffffffffde8 = 2;
      in_stack_fffffffffffffdf0 =
           "SQLiteBatch: Batch closed and failed to abort transaction, resetting db connection..\n";
      logging_function_00._M_len._7_1_ = bVar8;
      logging_function_00._M_len._0_7_ = in_stack_fffffffffffffeb0;
      logging_function_00._M_str = (char *)plVar9;
      source_file_00._M_str = in_stack_fffffffffffffea8;
      source_file_00._M_len =
           (size_t)
           "SQLiteBatch: Batch closed and failed to abort transaction, resetting db connection..\n";
      LogPrintFormatInternal<>
                (logging_function_00,source_file_00,in_stack_fffffffffffffe5c,
                 in_stack_fffffffffffffe50,in_stack_ffffffffffffff90,in_stack_fffffffffffffe98);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      in_stack_fffffffffffffea8 =
           "SQLiteBatch: Batch closed unexpectedly without the transaction being explicitly committed or aborted\n"
      ;
      in_stack_fffffffffffffde8 = 2;
      in_stack_fffffffffffffdf0 =
           "SQLiteBatch: Batch closed unexpectedly without the transaction being explicitly committed or aborted\n"
      ;
      logging_function._M_len._7_1_ = bVar8;
      logging_function._M_len._0_7_ = in_stack_fffffffffffffeb0;
      logging_function._M_str = (char *)plVar9;
      source_file._M_str =
           "SQLiteBatch: Batch closed unexpectedly without the transaction being explicitly committed or aborted\n"
      ;
      source_file._M_len = (size_t)in_stack_fffffffffffffea0;
      LogPrintFormatInternal<>
                (logging_function,source_file,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe50,
                 in_stack_ffffffffffffff90,in_stack_fffffffffffffe98);
    }
  }
  local_b8 = in_RDI + 3;
  local_c0 = "read";
  ppVar6 = (iterator)&stack0xffffffffffffffa8;
  std::pair<sqlite3_stmt_**,_const_char_*>::pair<sqlite3_stmt_**,_true>
            (in_stack_fffffffffffffdf8,(sqlite3_stmt ***)in_stack_fffffffffffffdf0,
             (char **)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  local_c8 = in_RDI + 4;
  local_d0 = "insert";
  std::pair<sqlite3_stmt_**,_const_char_*>::pair<sqlite3_stmt_**,_true>
            (in_stack_fffffffffffffdf8,(sqlite3_stmt ***)in_stack_fffffffffffffdf0,
             (char **)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  local_d8 = in_RDI + 5;
  local_e0 = "overwrite";
  std::pair<sqlite3_stmt_**,_const_char_*>::pair<sqlite3_stmt_**,_true>
            (in_stack_fffffffffffffdf8,(sqlite3_stmt ***)in_stack_fffffffffffffdf0,
             (char **)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  local_e8 = in_RDI + 6;
  local_f0 = "delete";
  std::pair<sqlite3_stmt_**,_const_char_*>::pair<sqlite3_stmt_**,_true>
            (in_stack_fffffffffffffdf8,(sqlite3_stmt ***)in_stack_fffffffffffffdf0,
             (char **)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  local_f8 = in_RDI + 7;
  local_100 = "delete prefix";
  std::pair<sqlite3_stmt_**,_const_char_*>::pair<sqlite3_stmt_**,_true>
            (in_stack_fffffffffffffdf8,(sqlite3_stmt ***)in_stack_fffffffffffffdf0,
             (char **)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  fmt.fmt = (char *)0x5;
  puVar7 = &local_101;
  std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>::allocator
            ((allocator<std::pair<sqlite3_stmt_**,_const_char_*>_> *)
             CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  __l._M_len = (size_type)puVar7;
  __l._M_array = ppVar6;
  std::
  vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
  ::vector((vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
            *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),__l,
           in_stack_fffffffffffffe20);
  std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>::~allocator
            ((allocator<std::pair<sqlite3_stmt_**,_const_char_*>_> *)
             CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  local_110 = (pair<sqlite3_stmt_**,_const_char_*> *)
              std::
              vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
              ::begin((vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
                       *)in_stack_fffffffffffffdf0);
  local_118 = (pair<sqlite3_stmt_**,_const_char_*> *)
              std::
              vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
              ::end((vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
                     *)in_stack_fffffffffffffdf0);
  while (bVar2 = __gnu_cxx::
                 operator==<const_std::pair<sqlite3_stmt_**,_const_char_*>_*,_std::vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>_>
                           ((__normal_iterator<const_std::pair<sqlite3_stmt_**,_const_char_*>_*,_std::vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>_>
                             *)in_stack_fffffffffffffdf8,
                            (__normal_iterator<const_std::pair<sqlite3_stmt_**,_const_char_*>_*,_std::vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>_>
                             *)in_stack_fffffffffffffdf0), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_std::pair<sqlite3_stmt_**,_const_char_*>_*,_std::vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>_>
    ::operator*((__normal_iterator<const_std::pair<sqlite3_stmt_**,_const_char_*>_*,_std::vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    pppsVar4 = std::get<0ul,sqlite3_stmt**,char_const*>
                         ((pair<sqlite3_stmt_**,_const_char_*> *)
                          CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    ppVar5 = (pair<sqlite3_stmt_**,_const_char_*> *)
             std::get<1ul,sqlite3_stmt**,char_const*>
                       ((pair<sqlite3_stmt_**,_const_char_*> *)
                        CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    source_line = sqlite3_finalize(**pppsVar4);
    if (source_line != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      in_stack_fffffffffffffdf0 =
           "SQLiteBatch: Batch closed but could not finalize %s statement: %s\n";
      local_140[0] = sqlite3_errstr(source_line);
      in_stack_fffffffffffffe00 = (char *)local_140;
      in_stack_fffffffffffffde8 = 2;
      logging_function_01._M_len._7_1_ = bVar8;
      logging_function_01._M_len._0_7_ = in_stack_fffffffffffffeb0;
      logging_function_01._M_str = (char *)plVar9;
      source_file_01._M_str = in_stack_fffffffffffffea8;
      source_file_01._M_len = (size_t)in_stack_fffffffffffffea0;
      LogPrintFormatInternal<char_const*,char_const*>
                (logging_function_01,source_file_01,source_line,(LogFlags)in_stack_fffffffffffffdf0,
                 in_stack_ffffffffffffff90,fmt,in_stack_ffffffffffffffa0,
                 (char **)in_stack_ffffffffffffffa8);
      in_stack_fffffffffffffdf8 = ppVar5;
    }
    **pppsVar4 = (sqlite3_stmt *)0x0;
    __gnu_cxx::
    __normal_iterator<const_std::pair<sqlite3_stmt_**,_const_char_*>_*,_std::vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>_>
    ::operator++((__normal_iterator<const_std::pair<sqlite3_stmt_**,_const_char_*>_*,_std::vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  }
  if ((bVar8 & 1) != 0) {
    (**(code **)(*(long *)in_RDI[1] + 0x40))();
    (**(code **)(*(long *)in_RDI[1] + 0x10))();
    CSemaphore::post((CSemaphore *)in_stack_fffffffffffffdf0);
  }
  std::
  vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
  ::~vector((vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
             *)in_stack_fffffffffffffdf8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void SQLiteBatch::Close()
{
    bool force_conn_refresh = false;

    // If we began a transaction, and it wasn't committed, abort the transaction in progress
    if (m_txn) {
        if (TxnAbort()) {
            LogPrintf("SQLiteBatch: Batch closed unexpectedly without the transaction being explicitly committed or aborted\n");
        } else {
            // If transaction cannot be aborted, it means there is a bug or there has been data corruption. Try to recover in this case
            // by closing and reopening the database. Closing the database should also ensure that any changes made since the transaction
            // was opened will be rolled back and future transactions can succeed without committing old data.
            force_conn_refresh = true;
            LogPrintf("SQLiteBatch: Batch closed and failed to abort transaction, resetting db connection..\n");
        }
    }

    // Free all of the prepared statements
    const std::vector<std::pair<sqlite3_stmt**, const char*>> statements{
        {&m_read_stmt, "read"},
        {&m_insert_stmt, "insert"},
        {&m_overwrite_stmt, "overwrite"},
        {&m_delete_stmt, "delete"},
        {&m_delete_prefix_stmt, "delete prefix"},
    };

    for (const auto& [stmt_prepared, stmt_description] : statements) {
        int res = sqlite3_finalize(*stmt_prepared);
        if (res != SQLITE_OK) {
            LogPrintf("SQLiteBatch: Batch closed but could not finalize %s statement: %s\n",
                      stmt_description, sqlite3_errstr(res));
        }
        *stmt_prepared = nullptr;
    }

    if (force_conn_refresh) {
        m_database.Close();
        try {
            m_database.Open();
            // If TxnAbort failed and we refreshed the connection, the semaphore was not released, so release it here to avoid deadlocks on future writes.
            m_database.m_write_semaphore.post();
        } catch (const std::runtime_error&) {
            // If open fails, cleanup this object and rethrow the exception
            m_database.Close();
            throw;
        }
    }
}